

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint8_t access_get_byte(CPUS390XState_conflict *env,S390Access *access,int offset,uintptr_t ra)

{
  uint8_t uVar1;
  
  if (offset < (int)(uint)access->size1) {
    uVar1 = do_access_get_byte(env,access->vaddr1,&access->haddr1,offset,access->mmu_idx,ra);
    return uVar1;
  }
  uVar1 = do_access_get_byte(env,access->vaddr2,&access->haddr2,offset - (uint)access->size1,
                             access->mmu_idx,ra);
  return uVar1;
}

Assistant:

static uint8_t access_get_byte(CPUS390XState *env, S390Access *access,
                               int offset, uintptr_t ra)
{
    if (offset < access->size1) {
        return do_access_get_byte(env, access->vaddr1, &access->haddr1,
                                  offset, access->mmu_idx, ra);
    }
    return do_access_get_byte(env, access->vaddr2, &access->haddr2,
                              offset - access->size1, access->mmu_idx, ra);
}